

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void canvas_paste(_glist *x)

{
  t_gobj *ptVar1;
  t_selection *ptVar2;
  void *data;
  t_gobj **pptVar3;
  int d_offset;
  t_selection **pptVar4;
  int y0;
  int x0;
  
  if (x->gl_editor == (t_editor *)0x0) {
    return;
  }
  if (x->gl_editor->e_textedfor == (_rtext *)0x0) {
    x0 = 0;
    y0 = 0;
    d_offset = 0;
    binbuf_getpos(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor,&x0,&y0,(t_symbol **)0x0);
    do {
      pptVar3 = &x->gl_list;
      while( true ) {
        ptVar1 = *pptVar3;
        if (ptVar1 == (t_gobj *)0x0) {
          data = canvas_undo_set_paste(x,0,0,d_offset);
          canvas_undo_add(x,UNDO_PASTE,"paste",data);
          canvas_dopaste(x,*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
          if (d_offset == 0) {
            return;
          }
          pptVar4 = &x->gl_editor->e_selection;
          while (ptVar2 = *pptVar4, ptVar2 != (t_selection *)0x0) {
            gobj_displace(ptVar2->sel_what,x,d_offset,d_offset);
            pptVar4 = &ptVar2->sel_next;
          }
          return;
        }
        if ((x0 + d_offset == (int)*(short *)&ptVar1[2].g_next) &&
           (y0 + d_offset == (int)*(short *)((long)&ptVar1[2].g_next + 2))) break;
        pptVar3 = &ptVar1->g_next;
      }
      d_offset = d_offset + 10;
    } while( true );
  }
  pdgui_vmess("pdtk_pastetext","^",x);
  return;
}

Assistant:

static void canvas_paste(t_canvas *x)
{
    if (!x->gl_editor)
        return;
    if (x->gl_editor->e_textedfor)
    {
            /* simulate keystrokes as if the copy buffer were typed in. */
        pdgui_vmess("pdtk_pastetext", "^", x);
    }
    else
    {
        int offset = 0;
        int x0 = 0, y0 = 0;
        int foundplace = 0;
        binbuf_getpos(EDITOR->copy_binbuf, &x0, &y0, 0);
        do {
                /* iterate over all existing objects
                 * to see whether one occupies the space we want.
                 * if so, move along
                 */
            t_gobj *y;
            foundplace = 1;
            for (y = x->gl_list; y; y = y->g_next) {
                t_text *txt = (t_text *)y;
                if((x0 + offset) == txt->te_xpix && (y0 + offset) == txt->te_ypix)
                {
                    foundplace = 0;
                    offset += PASTE_OFFSET;
                    break;
                }
            }
        } while(!foundplace);
        canvas_undo_add(x, UNDO_PASTE, "paste",
            (void *)canvas_undo_set_paste(x, 0, 0, offset));
        canvas_dopaste(x, EDITOR->copy_binbuf);
        if(offset)
        {
            t_selection *y;
            for (y = x->gl_editor->e_selection; y; y = y->sel_next)
                gobj_displace(y->sel_what, x,
                    offset, offset);
        }
    }
}